

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall
Darts::Details::DoubleArrayBuilder::arrange_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  bool bVar1;
  id_type iVar2;
  int value;
  size_t sVar3;
  DoubleArrayBuilderUnit *this_00;
  uchar *puVar4;
  extra_type *this_01;
  DoubleArrayBuilder *in_RDI;
  id_type dic_child_id;
  size_t i;
  id_type offset;
  id_type dawg_child_id;
  DoubleArrayBuilderUnit *in_stack_ffffffffffffff98;
  DawgBuilder *in_stack_ffffffffffffffa0;
  id_type in_stack_ffffffffffffffac;
  DoubleArrayBuilderUnit *in_stack_ffffffffffffffb0;
  ulong uVar5;
  DoubleArrayBuilder *in_stack_ffffffffffffffb8;
  ulong local_30;
  id_type local_1c;
  
  AutoPool<unsigned_char>::resize
            ((AutoPool<unsigned_char> *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98)
  ;
  local_1c = DawgBuilder::child(in_stack_ffffffffffffffa0,
                                (id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  while (local_1c != 0) {
    in_stack_ffffffffffffffb8 = (DoubleArrayBuilder *)&in_RDI->labels_;
    DawgBuilder::label(in_stack_ffffffffffffffa0,(id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                      );
    AutoPool<unsigned_char>::append
              ((AutoPool<unsigned_char> *)in_stack_ffffffffffffffa0,
               (uchar *)in_stack_ffffffffffffff98);
    local_1c = DawgBuilder::sibling
                         (in_stack_ffffffffffffffa0,
                          (id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  iVar2 = find_valid_offset(in_stack_ffffffffffffffb8,
                            (id_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
            ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)in_stack_ffffffffffffffa0,
             (size_t)in_stack_ffffffffffffff98);
  DoubleArrayBuilderUnit::set_offset(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  DawgBuilder::child(in_stack_ffffffffffffffa0,(id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  local_30 = 0;
  while( true ) {
    uVar5 = local_30;
    sVar3 = AutoPool<unsigned_char>::size(&in_RDI->labels_);
    if (sVar3 <= uVar5) break;
    AutoPool<unsigned_char>::operator[]
              ((AutoPool<unsigned_char> *)in_stack_ffffffffffffffa0,
               (size_t)in_stack_ffffffffffffff98);
    reserve_id(in_RDI,(id_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    bVar1 = DawgBuilder::is_leaf
                      (in_stack_ffffffffffffffa0,(id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                      );
    if (bVar1) {
      this_00 = AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                          ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)
                           in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
      DoubleArrayBuilderUnit::set_has_leaf(this_00,true);
      in_stack_ffffffffffffffa0 =
           (DawgBuilder *)
           AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                     ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)in_stack_ffffffffffffffa0,
                      (size_t)in_stack_ffffffffffffff98);
      value = DawgBuilder::value(in_stack_ffffffffffffffa0,
                                 (id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      DoubleArrayBuilderUnit::set_value((DoubleArrayBuilderUnit *)in_stack_ffffffffffffffa0,value);
    }
    else {
      in_stack_ffffffffffffff98 =
           AutoPool<Darts::Details::DoubleArrayBuilderUnit>::operator[]
                     ((AutoPool<Darts::Details::DoubleArrayBuilderUnit> *)in_stack_ffffffffffffffa0,
                      (size_t)in_stack_ffffffffffffff98);
      puVar4 = AutoPool<unsigned_char>::operator[]
                         ((AutoPool<unsigned_char> *)in_stack_ffffffffffffffa0,
                          (size_t)in_stack_ffffffffffffff98);
      DoubleArrayBuilderUnit::set_label(in_stack_ffffffffffffff98,*puVar4);
    }
    DawgBuilder::sibling
              (in_stack_ffffffffffffffa0,(id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_30 = local_30 + 1;
  }
  this_01 = extras((DoubleArrayBuilder *)in_stack_ffffffffffffffa0,
                   (id_type)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  DoubleArrayBuilderExtraUnit::set_is_used(this_01,true);
  return iVar2;
}

Assistant:

inline id_type DoubleArrayBuilder::arrange_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  labels_.resize(0);

  id_type dawg_child_id = dawg.child(dawg_id);
  while (dawg_child_id != 0) {
    labels_.append(dawg.label(dawg_child_id));
    dawg_child_id = dawg.sibling(dawg_child_id);
  }

  id_type offset = find_valid_offset(dic_id);
  units_[dic_id].set_offset(dic_id ^ offset);

  dawg_child_id = dawg.child(dawg_id);
  for (std::size_t i = 0; i < labels_.size(); ++i) {
    id_type dic_child_id = offset ^ labels_[i];
    reserve_id(dic_child_id);

    if (dawg.is_leaf(dawg_child_id)) {
      units_[dic_id].set_has_leaf(true);
      units_[dic_child_id].set_value(dawg.value(dawg_child_id));
    } else {
      units_[dic_child_id].set_label(labels_[i]);
    }

    dawg_child_id = dawg.sibling(dawg_child_id);
  }
  extras(offset).set_is_used(true);

  return offset;
}